

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::objectStreams(Config *this,string *parameter)

{
  bool bVar1;
  element_type *peVar2;
  allocator<char> local_39;
  string local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *parameter_local;
  Config *this_local;
  
  local_18 = parameter;
  parameter_local = (string *)this;
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->o);
  peVar2->object_stream_set = true;
  bVar1 = std::operator==(local_18,"disable");
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->o);
    peVar2->object_stream_mode = qpdf_o_disable;
  }
  else {
    bVar1 = std::operator==(local_18,"preserve");
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this->o);
      peVar2->object_stream_mode = qpdf_o_preserve;
    }
    else {
      bVar1 = std::operator==(local_18,"generate");
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this->o);
        peVar2->object_stream_mode = qpdf_o_generate;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"invalid object stream mode",&local_39);
        usage(&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator(&local_39);
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::objectStreams(std::string const& parameter)
{
    o.m->object_stream_set = true;
    if (parameter == "disable") {
        o.m->object_stream_mode = qpdf_o_disable;
    } else if (parameter == "preserve") {
        o.m->object_stream_mode = qpdf_o_preserve;
    } else if (parameter == "generate") {
        o.m->object_stream_mode = qpdf_o_generate;
    } else {
        usage("invalid object stream mode");
    }
    return this;
}